

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

int getPrec(OPCODE opcode)

{
  uint uVar1;
  
  uVar1 = 5;
  if (opcode != OP_Equal) {
    uVar1 = 4;
    if ((((opcode & ~OP_Minus) != OP_Closed_parenthesis) && (uVar1 = 3, OP_Minus < opcode)) &&
       (uVar1 = 2, (opcode & ~OP_Minus) != OP_Multi)) {
      uVar1 = (uint)(opcode == OP_Pow);
    }
  }
  return uVar1;
}

Assistant:

int getPrec(enum OPCODE opcode)
{
    if (opcode == OP_Equal) {
        return 5;
    }

    if (opcode == OP_Open_parenthesis ||
        opcode == OP_Closed_parenthesis) {
        return 4;
    }

    if (opcode == OP_Plus ||
        opcode == OP_Minus) {
        return 3;
    }

    if (opcode == OP_Multi ||
        opcode == OP_Div) {
        return 2;
    }

    if (opcode == OP_Pow) {
        return 1;
    }

    return 0;
}